

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

MVOverEl<double> * __thiscall
mp::pre::ValuePresolver::PresolveSolution
          (MVOverEl<double> *__return_storage_ptr__,ValuePresolver *this,MVOverEl<double> *mv,
          ValueResolution param_2)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  bool bVar8;
  double dVar9;
  
  ValuePresolverImpl::PresolveSolution
            (__return_storage_ptr__,&this->super_ValuePresolverImpl,mv,ValResLast);
  pvVar6 = ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
                     (&__return_storage_ptr__->vars_);
  iVar4 = (*this->model_->_vptr_BasicFlatModel[2])();
  iVar5 = (*this->model_->_vptr_BasicFlatModel[3])();
  pdVar1 = (pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
  lVar3 = *(long *)CONCAT44(extraout_var_00,iVar5);
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    dVar9 = *(double *)(lVar2 + lVar7 * 8);
    if ((pdVar1[lVar7] < dVar9) || (dVar9 = *(double *)(lVar3 + lVar7 * 8), dVar9 < pdVar1[lVar7]))
    {
      pdVar1[lVar7] = dVar9;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MVOverEl<double> PresolveSolution (
      const MVOverEl<double>& mv,
      ValueResolution  = ValueResolution::ValResLast) override {
    auto result = ValuePresolverImpl::PresolveSolution(
        mv, ValueResolution::ValResLast);
    auto& x = result.GetVarValues()();
    const auto& lbs = model_.GetVarLBs();
    const auto& ubs = model_.GetVarUBs();
    assert(x.size() == lbs.size());
    assert(lbs.size() == ubs.size());
    for (auto i=x.size(); i--; ) {
      if (x[i]<lbs[i])
        x[i]=lbs[i];
      else
        if (x[i]>ubs[i])
          x[i]=ubs[i];
    }
    return result;
  }